

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::SADSkipx4Test_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::SADSkipx4Test_DISABLED_Speed_Test> *this)

{
  SADSkipx4Test_DISABLED_Speed_Test *this_00;
  long in_RDI;
  Test *local_28;
  
  WithParamInterface<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (SADSkipx4Test_DISABLED_Speed_Test *)operator_new(0x48);
  anon_unknown.dwarf_14174cb::SADSkipx4Test_DISABLED_Speed_Test::SADSkipx4Test_DISABLED_Speed_Test
            (this_00);
  local_28 = (Test *)0x0;
  if (this_00 != (SADSkipx4Test_DISABLED_Speed_Test *)0x0) {
    local_28 = &(this_00->super_SADSkipx4Test).super_SADTestBase.super_Test;
  }
  return local_28;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }